

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree
          (TaprootScriptTree *this,uint8_t leaf_version,Script *script)

{
  CfdException *this_00;
  long lVar1;
  uint8_t local_49;
  undefined1 local_48 [32];
  
  local_49 = leaf_version;
  TapBranch::TapBranch(&this->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = leaf_version;
  Script::operator=(&(this->super_TapBranch).script_,script);
  lVar1 = 0;
  do {
    if (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar1) ==
        (uint)leaf_version) {
      return;
    }
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x24);
  if (((leaf_version & 1) == 0) && ((byte)(leaf_version + 0x40) < 0x3f)) {
    return;
  }
  local_48._0_8_ = "cfdcore_taproot.cpp";
  local_48._8_4_ = 0x1cf;
  local_48._16_8_ = "TaprootScriptTree";
  logger::log<unsigned_char&>
            ((CfdSourceLocation *)local_48,kCfdLogLevelWarning,"Unsupported leaf version. [{}]",
             &local_49);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Unsupported leaf version.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

TaprootScriptTree::TaprootScriptTree(
    uint8_t leaf_version, const Script& script)
    : TapBranch() {
  has_leaf_ = true;
  leaf_version_ = leaf_version;
  script_ = script;
  if (!TaprootUtil::IsValidLeafVersion(leaf_version)) {
    warn(CFD_LOG_SOURCE, "Unsupported leaf version. [{}]", leaf_version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
}